

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  ImDrawCmd *pIVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *__dest;
  int iVar9;
  int iVar10;
  void *pvVar11;
  undefined4 uStack_2c;
  
  lVar7 = (long)(this->_ClipRectStack).Size;
  pIVar8 = (this->_ClipRectStack).Data + lVar7 + -1;
  if (lVar7 == 0) {
    pIVar8 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar8->x;
  fVar2 = pIVar8->w;
  fVar4 = pIVar8->y;
  fVar5 = pIVar8->z;
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  iVar6 = (this->CmdBuffer).Size;
  if (iVar6 == (this->CmdBuffer).Capacity) {
    if (iVar6 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar6 / 2 + iVar6;
    }
    iVar10 = iVar6 + 1;
    if (iVar6 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x30);
    pIVar3 = (this->CmdBuffer).Data;
    if (pIVar3 != (ImDrawCmd *)0x0) {
      memcpy(__dest,pIVar3,(long)(this->CmdBuffer).Size * 0x30);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = __dest;
    (this->CmdBuffer).Capacity = iVar10;
    iVar6 = (this->CmdBuffer).Size;
  }
  else {
    __dest = (this->CmdBuffer).Data;
  }
  lVar7 = (ulong)(uint)fVar1 << 0x20;
  __dest[iVar6].ElemCount = (int)lVar7;
  __dest[iVar6].ClipRect.x = (float)(int)((ulong)lVar7 >> 0x20);
  pIVar3 = __dest + iVar6;
  (pIVar3->ClipRect).y = fVar4;
  (pIVar3->ClipRect).z = fVar5;
  *(ulong *)(&(pIVar3->ClipRect).y + 2) = CONCAT44(uStack_2c,fVar2);
  __dest[iVar6].TextureId = pvVar11;
  __dest[iVar6].UserCallback = (ImDrawCallback)0x0;
  (&__dest[iVar6].UserCallback)[1] = (ImDrawCallback)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}